

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O0

void duckdb::EquiWidthBinFunction<long,duckdb::EquiWidthBinsInteger>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t iVar1;
  Vector *in_RDX;
  DataChunk *in_RDI;
  Vector intermediate_result;
  value_type *nice_rounding;
  value_type *bin_count;
  value_type *max_arg;
  value_type *min_arg;
  size_type in_stack_fffffffffffffed8;
  Vector *in_stack_fffffffffffffee0;
  Vector *in_stack_fffffffffffffee8;
  reference d;
  reference c;
  reference b;
  reference a;
  anon_class_8_1_a8a4b3b1 fun;
  LogicalType local_d0 [24];
  LogicalType local_b8 [24];
  Vector local_a0 [104];
  reference local_38;
  reference local_30;
  reference local_28;
  reference local_20;
  Vector *local_18;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffee0,
                        in_stack_fffffffffffffed8);
  local_28 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffee0,
                        in_stack_fffffffffffffed8);
  local_30 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffee0,
                        in_stack_fffffffffffffed8);
  local_38 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffee0,
                        in_stack_fffffffffffffed8);
  fun.state = (ExpressionState *)local_d0;
  duckdb::LogicalType::LogicalType((LogicalType *)fun.state,BIGINT);
  duckdb::LogicalType::LIST(local_b8);
  duckdb::Vector::Vector(local_a0,local_b8,0x800);
  duckdb::LogicalType::~LogicalType(local_b8);
  duckdb::LogicalType::~LogicalType(local_d0);
  d = local_20;
  c = local_28;
  b = local_30;
  a = local_38;
  DataChunk::size(local_8);
  GenericExecutor::
  ExecuteQuaternary<duckdb::PrimitiveType<long>,duckdb::PrimitiveType<long>,duckdb::PrimitiveType<long>,duckdb::PrimitiveType<bool>,duckdb::GenericListType<duckdb::PrimitiveType<long>>,duckdb::EquiWidthBinFunction<long,duckdb::EquiWidthBinsInteger>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::PrimitiveType<long>,duckdb::PrimitiveType<long>,duckdb::PrimitiveType<long>,duckdb::PrimitiveType<bool>)_1_>
            (a,b,c,d,in_stack_fffffffffffffee8,(idx_t)in_stack_fffffffffffffee0,fun);
  iVar1 = DataChunk::size(local_8);
  duckdb::VectorOperations::DefaultCast(local_a0,local_18,iVar1,false);
  Vector::~Vector(in_stack_fffffffffffffee0);
  return;
}

Assistant:

static void EquiWidthBinFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	static constexpr int64_t MAX_BIN_COUNT = 1000000;
	auto &min_arg = args.data[0];
	auto &max_arg = args.data[1];
	auto &bin_count = args.data[2];
	auto &nice_rounding = args.data[3];

	Vector intermediate_result(LogicalType::LIST(OP::LOGICAL_TYPE));
	GenericExecutor::ExecuteQuaternary<PrimitiveType<T>, PrimitiveType<T>, PrimitiveType<int64_t>, PrimitiveType<bool>,
	                                   GenericListType<PrimitiveType<T>>>(
	    min_arg, max_arg, bin_count, nice_rounding, intermediate_result, args.size(),
	    [&](PrimitiveType<T> min_p, PrimitiveType<T> max_p, PrimitiveType<int64_t> bins_p,
	        PrimitiveType<bool> nice_rounding_p) {
		    if (max_p.val < min_p.val) {
			    throw InvalidInputException(state.expr,
			                                "Invalid input for bin function - max value is smaller than min value");
		    }
		    if (bins_p.val <= 0) {
			    throw InvalidInputException(state.expr, "Invalid input for bin function - there must be > 0 bins");
		    }
		    if (bins_p.val > MAX_BIN_COUNT) {
			    throw InvalidInputException(state.expr, "Invalid input for bin function - max bin count of %d exceeded",
			                                MAX_BIN_COUNT);
		    }
		    GenericListType<PrimitiveType<T>> result_bins;
		    if (max_p.val == min_p.val) {
			    // if max = min return a single bucket
			    result_bins.values.push_back(max_p.val);
		    } else {
			    result_bins.values = OP::Operation(state.expr, min_p.val, max_p.val, static_cast<idx_t>(bins_p.val),
			                                       nice_rounding_p.val);
			    // last bin should always be the input max
			    if (result_bins.values[0].val < max_p.val) {
				    result_bins.values[0].val = max_p.val;
			    }
			    std::reverse(result_bins.values.begin(), result_bins.values.end());
		    }
		    return result_bins;
	    });
	VectorOperations::DefaultCast(intermediate_result, result, args.size());
}